

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS
ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,REF_GRID freeable_ref_grid,REF_BOOL direct)

{
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_FACELIFT pRVar4;
  REF_SEARCH *ppRVar5;
  long lVar6;
  REF_DBL *pRVar7;
  REF_BOOL *pRVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  REF_GEOM ref_geom;
  long lVar14;
  REF_CELL pRVar15;
  undefined8 uStack_e0;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT nodes [27];
  
  pRVar4 = (REF_FACELIFT)malloc(0x38);
  *ref_facelift_ptr = pRVar4;
  if (pRVar4 == (REF_FACELIFT)0x0) {
    pcVar12 = "malloc *ref_facelift_ptr of REF_FACELIFT_STRUCT NULL";
    uVar10 = 0x79;
    goto LAB_00195929;
  }
  pRVar4->grid = freeable_ref_grid;
  pRVar15 = freeable_ref_grid->cell[0];
  pRVar4->edg_cell = pRVar15;
  pRVar4->tri_cell = freeable_ref_grid->cell[3];
  pRVar1 = freeable_ref_grid->cell[1];
  if (0 < pRVar1->n) {
    pRVar4->edg_cell = pRVar1;
    pRVar15 = pRVar1;
  }
  pRVar1 = freeable_ref_grid->cell[2];
  if (0 < pRVar1->n) {
    pRVar4->edg_cell = pRVar1;
    pRVar15 = pRVar1;
  }
  if (0 < freeable_ref_grid->cell[4]->n) {
    pRVar4->tri_cell = freeable_ref_grid->cell[4];
  }
  if (0 < freeable_ref_grid->cell[5]->n) {
    pRVar4->tri_cell = freeable_ref_grid->cell[5];
  }
  if (direct == 0) {
    ref_geom = freeable_ref_grid->geom;
    lVar14 = (long)ref_geom->max;
    if (lVar14 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL negative");
      return 1;
    }
    uVar2 = ref_geom->max * 3;
    pRVar7 = (REF_DBL *)malloc((ulong)uVar2 << 3);
    pRVar4->displacement = pRVar7;
    if (pRVar7 == (REF_DBL *)0x0) {
      pcVar12 = "malloc ref_facelift->displacement of REF_DBL NULL";
      uVar10 = 0x9a;
LAB_00195929:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar10,"ref_facelift_create",pcVar12);
      return 2;
    }
    uVar9 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      pRVar7[uVar9] = 0.0;
    }
    pRVar8 = (REF_BOOL *)malloc(lVar14 * 4);
    pRVar4->strong_bc = pRVar8;
    if (pRVar8 == (REF_BOOL *)0x0) {
      pcVar12 = "malloc ref_facelift->strong_bc of REF_BOOL NULL";
      uVar10 = 0x9b;
      goto LAB_00195929;
    }
    for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
      pRVar8[lVar6] = 0;
    }
  }
  else {
    pRVar4->displacement = (REF_DBL *)0x0;
    pRVar4->strong_bc = (REF_BOOL *)0x0;
    ref_geom = freeable_ref_grid->geom;
  }
  pRVar4->edge_search = (REF_SEARCH *)0x0;
  lVar14 = (long)ref_geom->nedge;
  if (lVar14 < 1) {
LAB_00195aac:
    pRVar4->face_search = (REF_SEARCH *)0x0;
    lVar14 = (long)ref_geom->nface;
    if (lVar14 < 1) {
      return 0;
    }
    pRVar15 = pRVar4->tri_cell;
    ppRVar5 = (REF_SEARCH *)malloc(lVar14 * 8);
    pRVar4->face_search = ppRVar5;
    if (ppRVar5 == (REF_SEARCH *)0x0) {
      pcVar12 = "malloc ref_facelift->face_search of REF_SEARCH NULL";
      uStack_e0 = 0x5c;
LAB_00195bb8:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uStack_e0,"ref_facelift_cache_search",pcVar12);
      uVar11 = 2;
      goto LAB_00195d09;
    }
    for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
      pRVar4->face_search[lVar6] = (REF_SEARCH)0x0;
    }
    lVar6 = 0;
    do {
      if (lVar14 * 8 + 8 == lVar6 + 8) {
        iVar13 = 0;
        goto LAB_00195bd5;
      }
      uVar2 = ref_search_create((REF_SEARCH *)(lVar6 + (long)pRVar4->face_search),pRVar15->n);
      lVar6 = lVar6 + 8;
    } while (uVar2 == 0);
    uVar11 = (ulong)uVar2;
    pcVar12 = "create face search";
    uStack_e0 = 0x60;
  }
  else {
    ppRVar5 = (REF_SEARCH *)malloc(lVar14 * 8);
    pRVar4->edge_search = ppRVar5;
    if (ppRVar5 == (REF_SEARCH *)0x0) {
      pcVar12 = "malloc ref_facelift->edge_search of REF_SEARCH NULL";
      uStack_e0 = 0x40;
      goto LAB_00195bb8;
    }
    for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
      pRVar4->edge_search[lVar6] = (REF_SEARCH)0x0;
    }
    lVar6 = 0;
    do {
      if (lVar14 * 8 + 8 == lVar6 + 8) {
        iVar13 = 0;
        goto LAB_00195a2f;
      }
      uVar2 = ref_search_create((REF_SEARCH *)(lVar6 + (long)pRVar4->edge_search),pRVar15->n);
      lVar6 = lVar6 + 8;
    } while (uVar2 == 0);
    uVar11 = (ulong)uVar2;
    pcVar12 = "create edge search";
    uStack_e0 = 0x44;
  }
LAB_00195cfe:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
         uStack_e0,"ref_facelift_cache_search",uVar11,pcVar12);
LAB_00195d09:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x9e,
         "ref_facelift_create",uVar11,"cache tri uv");
  return (REF_STATUS)uVar11;
LAB_00195a2f:
  if (pRVar15->max <= iVar13) goto LAB_00195aac;
  RVar3 = ref_cell_nodes(pRVar15,iVar13,nodes);
  if (RVar3 == 0) {
    nodes[2] = nodes[pRVar15->node_per];
    uVar2 = ref_geom_edg_t_bounding_sphere2(ref_geom,nodes,local_c8,&local_d0);
    if (uVar2 != 0) {
      uVar11 = (ulong)uVar2;
      pcVar12 = "bound with circle";
      uStack_e0 = 0x4b;
      goto LAB_00195cfe;
    }
    local_c8[1] = 0.0;
    local_c8[2] = 0.0;
    uVar2 = ref_search_insert(pRVar4->edge_search[(long)nodes[2] + -1],iVar13,local_c8,
                              local_d0 + local_d0);
    if (uVar2 != 0) {
      uVar11 = (ulong)uVar2;
      pcVar12 = "ins";
      uStack_e0 = 0x51;
      goto LAB_00195cfe;
    }
  }
  iVar13 = iVar13 + 1;
  goto LAB_00195a2f;
LAB_00195bd5:
  if (pRVar15->max <= iVar13) {
    return 0;
  }
  RVar3 = ref_cell_nodes(pRVar15,iVar13,nodes);
  if (RVar3 == 0) {
    nodes[3] = nodes[pRVar15->node_per];
    uVar2 = ref_geom_tri_uv_bounding_sphere3(ref_geom,nodes,local_c8,&local_d0);
    if (uVar2 != 0) {
      uVar11 = (ulong)uVar2;
      pcVar12 = "bound with circle";
      uStack_e0 = 0x67;
      goto LAB_00195cfe;
    }
    local_c8[2] = 0.0;
    uVar2 = ref_search_insert(pRVar4->face_search[(long)nodes[3] + -1],iVar13,local_c8,
                              local_d0 + local_d0);
    if (uVar2 != 0) {
      uVar11 = (ulong)uVar2;
      pcVar12 = "ins";
      uStack_e0 = 0x6c;
      goto LAB_00195cfe;
    }
  }
  iVar13 = iVar13 + 1;
  goto LAB_00195bd5;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,
                                       REF_GRID freeable_ref_grid,
                                       REF_BOOL direct) {
  REF_FACELIFT ref_facelift;
  REF_INT n;

  ref_malloc(*ref_facelift_ptr, 1, REF_FACELIFT_STRUCT);

  ref_facelift = *ref_facelift_ptr;

  ref_facelift_grid(ref_facelift) = freeable_ref_grid;

  ref_facelift_edg(ref_facelift) =
      ref_grid_edg(ref_facelift_grid(ref_facelift));
  ref_facelift_tri(ref_facelift) =
      ref_grid_tri(ref_facelift_grid(ref_facelift));

  if (ref_cell_n(ref_grid_ed2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_ed3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed3(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr3(ref_facelift_grid(ref_facelift));
  }

  if (direct) {
    ref_facelift->displacement = NULL;
    ref_facelift->strong_bc = NULL;
  } else {
    n = ref_geom_max(ref_facelift_geom(ref_facelift));
    ref_malloc_init(ref_facelift->displacement, 3 * n, REF_DBL, 0.0);
    ref_malloc_init(ref_facelift->strong_bc, n, REF_BOOL, REF_FALSE);
  }

  RSS(ref_facelift_cache_search(ref_facelift), "cache tri uv");

  return REF_SUCCESS;
}